

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map.h
# Opt level: O0

string * __thiscall
bloaty::RangeMap::
EntryDebugString<std::_Rb_tree_iterator<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>>
          (RangeMap *this,
          _Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_> it)

{
  bool bVar1;
  string *in_RDI;
  string *in_stack_00000240;
  uint64_t in_stack_00000248;
  uint64_t in_stack_00000250;
  uint64_t in_stack_00000258;
  map<unsigned_long,_bloaty::RangeMap::Entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
  *in_stack_ffffffffffffff88;
  allocator<char> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  _Self local_28;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_> local_20 [2];
  iterator local_10 [2];
  
  std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>::
  _Rb_tree_const_iterator(local_20,local_10);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_bloaty::RangeMap::Entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
       ::end(in_stack_ffffffffffffff88);
  bVar1 = std::operator==(local_20,&local_28);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd7);
  }
  else {
    std::_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>::operator->
              ((_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_> *)
               0x190c74);
    std::_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>::operator->
              ((_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_> *)
               0x190c85);
    std::_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>::operator->
              ((_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_> *)
               0x190c98);
    std::_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>::operator->
              ((_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_> *)
               0x190cab);
    EntryDebugString(in_stack_00000258,in_stack_00000250,in_stack_00000248,in_stack_00000240);
  }
  return in_RDI;
}

Assistant:

std::string EntryDebugString(T it) const {
    if (it == mappings_.end()) {
      return "[end]";
    } else {
      return EntryDebugString(it->first, it->second.size,
                              it->second.other_start, it->second.label);
    }
  }